

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

int __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::countWithinDistance
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          model_t *model_coefficients,double threshold)

{
  element_type *this_00;
  size_type sVar1;
  reference pvVar2;
  undefined8 in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  int count;
  vector<double,_std::allocator<double>_> dist;
  vector<double,_std::allocator<double>_> *this_01;
  ulong local_48;
  int local_40;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  this_01 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xbf72bd);
  this_00 = std::
            __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0xbf72cb);
  std::vector<int,_std::allocator<int>_>::size(this_00);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI,&stack0xffffffffffffffd0);
  local_40 = 0;
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0);
    if (sVar1 <= local_48) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0,local_48
                       );
    if (*pvVar2 < in_XMM0_Qa) {
      local_40 = local_40 + 1;
    }
    local_48 = local_48 + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  return local_40;
}

Assistant:

int
opengv::sac::SampleConsensusProblem<M>::countWithinDistance(
    const model_t & model_coefficients, const double threshold)
{
  std::vector<double> dist;
  dist.reserve(indices_->size());
  getDistancesToModel( model_coefficients, dist );

  int count = 0;
  for( size_t i = 0; i < dist.size(); ++i )
  {
    if( dist[i] < threshold )
      ++count;
  }

  return count;
}